

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O0

void __thiscall QLineEdit::dropEvent(QLineEdit *this,QDropEvent *e)

{
  bool bVar1;
  DropAction DVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QLineEditPrivate *pQVar6;
  QLineEdit *pQVar7;
  QDropEvent *in_RSI;
  QLineEdit *in_RDI;
  long in_FS_OFFSET;
  int oldSelEnd;
  int oldSelStart;
  int selStart;
  int cursorPos;
  QLineEditPrivate *d;
  QString str;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  QWidgetLineControl *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined1 mark;
  QLineEditPrivate *this_00;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = d_func((QLineEdit *)0x5c8645);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QDropEvent::mimeData(in_RSI);
  QMimeData::text();
  bVar1 = QString::isNull((QString *)0x5c868f);
  if ((bVar1) ||
     (bVar1 = QWidgetLineControl::isReadOnly((QWidgetLineControl *)pQVar6->control), bVar1)) {
    QEvent::ignore((QEvent *)in_RSI);
    QWidget::update((QWidget *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  else {
    pQVar7 = (QLineEdit *)QDropEvent::source();
    if ((pQVar7 == in_RDI) && (DVar2 = QDropEvent::dropAction(in_RSI), DVar2 == CopyAction)) {
      deselect((QLineEdit *)in_stack_ffffffffffffff80);
    }
    this_00 = pQVar6;
    QDropEvent::position
              ((QDropEvent *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    QPointF::toPoint((QPointF *)this_00);
    QPoint::x((QPoint *)0x5c8716);
    iVar3 = QLineEditPrivate::xToPos
                      ((QLineEditPrivate *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                       (CursorPosition)in_stack_ffffffffffffff80);
    mark = (undefined1)((uint)in_stack_ffffffffffffff8c >> 0x18);
    iVar4 = QWidgetLineControl::selectionStart(in_stack_ffffffffffffff80);
    iVar5 = QWidgetLineControl::selectionEnd(in_stack_ffffffffffffff80);
    QWidgetLineControl::moveCursor
              ((QWidgetLineControl *)this_00,(int)((ulong)in_RDI >> 0x20),(bool)mark);
    pQVar6->field_0x27c = pQVar6->field_0x27c & 0xfb;
    QDropEvent::acceptProposedAction((QDropEvent *)0x5c8792);
    insert((QLineEdit *)in_stack_ffffffffffffff80,
           (QString *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    pQVar7 = (QLineEdit *)QDropEvent::source();
    if (pQVar7 == in_RDI) {
      DVar2 = QDropEvent::dropAction(in_RSI);
      if (DVar2 == MoveAction) {
        if ((iVar4 < iVar3) && (iVar3 <= iVar5)) {
          QString::size(&local_20);
          setSelection(in_RDI,(int)((ulong)this_00 >> 0x20),(int)this_00);
        }
        else if (iVar5 < iVar3) {
          QString::size(&local_20);
          QString::size(&local_20);
          setSelection(in_RDI,(int)((ulong)this_00 >> 0x20),(int)this_00);
        }
        else {
          QString::size(&local_20);
          setSelection(in_RDI,(int)((ulong)this_00 >> 0x20),(int)this_00);
        }
      }
      else {
        QString::size(&local_20);
        setSelection(in_RDI,(int)((ulong)this_00 >> 0x20),(int)this_00);
      }
    }
  }
  QString::~QString((QString *)0x5c88b5);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLineEdit::dropEvent(QDropEvent* e)
{
    Q_D(QLineEdit);
    QString str = e->mimeData()->text();

    if (!str.isNull() && !d->control->isReadOnly()) {
        if (e->source() == this && e->dropAction() == Qt::CopyAction)
            deselect();
        int cursorPos = d->xToPos(e->position().toPoint().x());
        int selStart = cursorPos;
        int oldSelStart = d->control->selectionStart();
        int oldSelEnd = d->control->selectionEnd();
        d->control->moveCursor(cursorPos, false);
        d->cursorVisible = false;
        e->acceptProposedAction();
        insert(str);
        if (e->source() == this) {
            if (e->dropAction() == Qt::MoveAction) {
                if (selStart > oldSelStart && selStart <= oldSelEnd)
                    setSelection(oldSelStart, str.size());
                else if (selStart > oldSelEnd)
                    setSelection(selStart - str.size(), str.size());
                else
                    setSelection(selStart, str.size());
            } else {
                setSelection(selStart, str.size());
            }
        }
    } else {
        e->ignore();
        update();
    }
}